

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::ClearOpsBufferStorageTestCase::initTestCaseGlobal(ClearOpsBufferStorageTestCase *this)

{
  uint uVar1;
  GLenum GVar2;
  uchar *puVar3;
  uint local_1c;
  uint local_18;
  uint local_14;
  uint n_bytes_needed;
  uint n_bytes_filled;
  ClearOpsBufferStorageTestCase *this_local;
  
  local_14 = 0;
  local_18 = this->m_n_pages_to_use * this->m_page_size;
  local_1c = this->m_page_size;
  _n_bytes_needed = this;
  uVar1 = SparseBufferTestUtilities::alignOffset(&local_18,&local_1c);
  this->m_sparse_bo_size_rounded = uVar1;
  (*this->m_gl->genBuffers)(1,&this->m_helper_bo);
  GVar2 = (*this->m_gl->getError)();
  glu::checkError(GVar2,"glGenBuffers() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x728);
  (*this->m_gl->bindBuffer)(0x8f36,this->m_helper_bo);
  GVar2 = (*this->m_gl->getError)();
  glu::checkError(GVar2,"glBindBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x72b);
  (*this->m_gl->bufferStorage)(0x8f36,(ulong)this->m_sparse_bo_size_rounded,(void *)0x0,0x101);
  GVar2 = (*this->m_gl->getError)();
  glu::checkError(GVar2,"glBufferStorage() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x72f);
  puVar3 = (uchar *)operator_new__((ulong)this->m_sparse_bo_size_rounded);
  this->m_initial_data = puVar3;
  for (; local_14 < this->m_sparse_bo_size_rounded; local_14 = local_14 + 1) {
    this->m_initial_data[local_14] = (uchar)local_14;
  }
  return true;
}

Assistant:

bool ClearOpsBufferStorageTestCase::initTestCaseGlobal()
{
	unsigned int	   n_bytes_filled = 0;
	const unsigned int n_bytes_needed = m_n_pages_to_use * m_page_size;

	/* Determine the number of bytes both the helper and the sparse buffer
	 * object need to be able to hold, at maximum */
	m_sparse_bo_size_rounded = SparseBufferTestUtilities::alignOffset(n_bytes_needed, m_page_size);

	/* Set up the helper BO */
	DE_ASSERT(m_helper_bo == 0);

	m_gl.genBuffers(1, &m_helper_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGenBuffers() call failed.");

	m_gl.bindBuffer(GL_COPY_READ_BUFFER, m_helper_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call failed.");

	m_gl.bufferStorage(GL_COPY_READ_BUFFER, m_sparse_bo_size_rounded, DE_NULL,
					   GL_DYNAMIC_STORAGE_BIT | GL_MAP_READ_BIT); /* flags */
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferStorage() call failed.");

	/* Set up a client-side data buffer we will use to fill the sparse BO with data,
	 * to be later cleared with the clear ops */
	DE_ASSERT(m_initial_data == DE_NULL);

	m_initial_data = new unsigned char[m_sparse_bo_size_rounded];

	while (n_bytes_filled < m_sparse_bo_size_rounded)
	{
		m_initial_data[n_bytes_filled] = static_cast<unsigned char>(n_bytes_filled % 256);

		++n_bytes_filled;
	}

	return true;
}